

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_pmull_q_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uintptr_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar7 = (ulong)uVar1;
  for (uVar10 = 0; uVar10 < uVar1 >> 3; uVar10 = uVar10 + 2) {
    lVar6 = uVar10 + (long)((int)desc >> 10);
    uVar2 = *(ulong *)((long)vn + lVar6 * 8);
    uVar3 = *(ulong *)((long)vm + lVar6 * 8);
    uVar9 = -(ulong)((uint)uVar2 & 1) & uVar3;
    uVar5 = 1;
    uVar8 = 0;
    lVar6 = 0x3f;
    while (lVar6 != 0) {
      uVar4 = -(ulong)((uVar2 >> (uVar5 & 0x3f) & 1) != 0);
      uVar9 = uVar9 ^ uVar3 << ((byte)uVar5 & 0x3f) & uVar4;
      uVar8 = uVar8 ^ uVar3 >> ((byte)lVar6 & 0x3f) & uVar4;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + -1;
    }
    *(ulong *)((long)vd + uVar10 * 8) = uVar9;
    *(ulong *)((long)vd + uVar10 * 8 + 8) = uVar8;
  }
  for (; uVar7 < (desc >> 2 & 0xf8) + 8; uVar7 = uVar7 + 8) {
    *(undefined8 *)((long)vd + uVar7) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_pmull_q)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    intptr_t hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; i += 2) {
        uint64_t nn = n[i + hi];
        uint64_t mm = m[i + hi];
        uint64_t rhi = 0;
        uint64_t rlo = 0;

        /* Bit 0 can only influence the low 64-bit result.  */
        if (nn & 1) {
            rlo = mm;
        }

        for (j = 1; j < 64; ++j) {
#ifdef _MSC_VER
            uint64_t mask = 0 - ((nn >> j) & 1);
#else
            uint64_t mask = -((nn >> j) & 1);
#endif
            rlo ^= (mm << j) & mask;
            rhi ^= (mm >> (64 - j)) & mask;
        }
        d[i] = rlo;
        d[i + 1] = rhi;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}